

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v8::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
          (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this,size_t size)

{
  size_t __t;
  uint *puVar1;
  pointer p;
  size_t sVar2;
  uint *__result;
  uint *local_68;
  uint *new_data;
  uint *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  size_t size_local;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this_local;
  
  local_68 = (uint *)std::allocator_traits<std::allocator<unsigned_int>_>::max_size
                               ((allocator_type *)&this->field_0xa0);
  __t = detail::buffer<unsigned_int>::capacity(&this->super_buffer<unsigned_int>);
  puVar1 = (uint *)(__t + (__t >> 1));
  old_data = (uint *)size;
  if ((size <= puVar1) && (old_data = puVar1, local_68 < puVar1)) {
    if (local_68 < size) {
      local_68 = (uint *)size;
    }
    old_data = local_68;
  }
  puVar1 = detail::buffer<unsigned_int>::data(&this->super_buffer<unsigned_int>);
  p = std::allocator_traits<std::allocator<unsigned_int>_>::allocate
                ((allocator_type *)&this->field_0xa0,(size_type)old_data);
  sVar2 = detail::buffer<unsigned_int>::size(&this->super_buffer<unsigned_int>);
  __result = detail::make_checked<unsigned_int>(p,(size_t)old_data);
  std::uninitialized_copy<unsigned_int*,unsigned_int*>(puVar1,puVar1 + sVar2,__result);
  detail::buffer<unsigned_int>::set(&this->super_buffer<unsigned_int>,p,(size_t)old_data);
  if (puVar1 != this->store_) {
    __gnu_cxx::new_allocator<unsigned_int>::deallocate
              ((new_allocator<unsigned_int> *)&this->field_0xa0,puVar1,__t);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void basic_memory_buffer<T, SIZE, Allocator>::grow(size_t size) {
#ifdef FMT_FUZZ
  if (size > 5000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity)
    new_capacity = size;
  else if (new_capacity > max_size)
    new_capacity = size > max_size ? size : max_size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}